

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::AddIndex
          (DataTable *this,ColumnList *columns,vector<duckdb::LogicalIndex,_true> *column_indexes,
          IndexConstraintType type,IndexStorageInfo *index_info)

{
  pointer pLVar1;
  DataTable *pDVar2;
  ColumnDefinition *this_00;
  string *args;
  LogicalType *args_1;
  TableIOManager *args_3;
  DataTableInfo *pDVar3;
  TransactionException *this_01;
  pointer pLVar4;
  IndexConstraintType type_local;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e8;
  _Head_base<0UL,_duckdb::Index_*,_false> local_e0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_d8;
  DataTable *local_d0;
  ColumnBinding binding;
  vector<unsigned_long,_true> physical_ids;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  expressions;
  string local_70;
  string local_50;
  
  type_local = type;
  local_d0 = this;
  if ((this->version)._M_i == MAIN_TABLE) {
    physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pLVar1 = (column_indexes->
             super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
             super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (pLVar4 = (column_indexes->
                  super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
                  super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start; pDVar2 = local_d0, pLVar4 != pLVar1;
        pLVar4 = pLVar4 + 1) {
      binding.column_index =
           (long)physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
      binding.table_index = 0;
      this_00 = ColumnList::GetColumn(columns,(LogicalIndex)pLVar4->index);
      args = ColumnDefinition::Name_abi_cxx11_(this_00);
      args_1 = ColumnDefinition::Type(this_00);
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::ColumnBinding&>
                ((duckdb *)&local_e8,args,args_1,&binding);
      local_d8._M_head_impl = local_e8._M_head_impl;
      local_e8._M_head_impl = (Expression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&expressions,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_d8);
      if (local_d8._M_head_impl != (Expression *)0x0) {
        (*((local_d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_d8._M_head_impl = (Expression *)ColumnDefinition::Physical(this_00);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&physical_ids,
                 (unsigned_long *)&local_d8);
      if (local_e8._M_head_impl != (Expression *)0x0) {
        (*((local_e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    args_3 = GetTableIOManager(local_d0);
    local_e8._M_head_impl = (Expression *)0x0;
    make_uniq<duckdb::ART,std::__cxx11::string_const&,duckdb::IndexConstraintType_const&,duckdb::vector<unsigned_long,true>&,duckdb::TableIOManager&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::AttachedDatabase&,decltype(nullptr),duckdb::IndexStorageInfo_const&>
              ((duckdb *)&binding,&index_info->name,&type_local,&physical_ids,args_3,&expressions,
               pDVar2->db,&local_e8._M_head_impl,index_info);
    pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&pDVar2->info);
    local_e0._M_head_impl = (Index *)binding.table_index;
    binding.table_index = 0;
    TableIndexList::AddIndex
              (&pDVar3->indexes,
               (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)&local_e0);
    if (local_e0._M_head_impl != (Index *)0x0) {
      (*(local_e0._M_head_impl)->_vptr_Index[1])();
    }
    local_e0._M_head_impl = (Index *)0x0;
    if (binding.table_index != 0) {
      (**(code **)(*(long *)binding.table_index + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&expressions);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&physical_ids);
    return;
  }
  this_01 = (TransactionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&physical_ids,
             "Transaction conflict: attempting to add an index to table \"%s\" but it has been %s by a different transaction"
             ,(allocator *)&expressions);
  GetTableName_abi_cxx11_(&local_50,local_d0);
  TableModification_abi_cxx11_(&local_70,local_d0);
  TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
            (this_01,(string *)&physical_ids,&local_50,&local_70);
  __cxa_throw(this_01,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DataTable::AddIndex(const ColumnList &columns, const vector<LogicalIndex> &column_indexes,
                         const IndexConstraintType type, const IndexStorageInfo &index_info) {
	if (!IsMainTable()) {
		throw TransactionException("Transaction conflict: attempting to add an index to table \"%s\" but it has been "
		                           "%s by a different transaction",
		                           GetTableName(), TableModification());
	}

	// Fetch the column types and create bound column reference expressions.
	vector<column_t> physical_ids;
	vector<unique_ptr<Expression>> expressions;

	for (const auto column_index : column_indexes) {
		auto binding = ColumnBinding(0, physical_ids.size());
		auto &col = columns.GetColumn(column_index);
		auto ref = make_uniq<BoundColumnRefExpression>(col.Name(), col.Type(), binding);
		expressions.push_back(std::move(ref));
		physical_ids.push_back(col.Physical().index);
	}

	// Create an ART around the expressions.
	auto &io_manager = TableIOManager::Get(*this);
	auto art = make_uniq<ART>(index_info.name, type, physical_ids, io_manager, std::move(expressions), db, nullptr,
	                          index_info);
	info->indexes.AddIndex(std::move(art));
}